

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  U32 UVar12;
  U32 UVar13;
  U32 UVar14;
  U32 UVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  size_t sVar20;
  size_t sVar21;
  BYTE *pBVar22;
  long lVar23;
  BYTE *pBVar24;
  ulong uVar25;
  bool bVar26;
  uint local_a28;
  uint local_a24;
  uint local_9dc;
  uint local_9d8;
  uint local_9d4;
  uint local_98c;
  uint local_988;
  uint local_984;
  uint local_93c;
  uint local_938;
  uint local_934;
  uint local_8ec;
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 tmpOff_3;
  size_t rLength_3;
  size_t step_3;
  U32 offcode_3;
  BYTE *match1_3;
  BYTE *match0_3;
  BYTE *repMatch_3;
  U32 matchIndex1_3;
  U32 matchIndex0_3;
  U32 current1_3;
  U32 current0_3;
  U32 val1_3;
  size_t h1_3;
  U32 val0_3;
  size_t h0_3;
  BYTE *ip2_3;
  size_t mLength_3;
  U32 maxRep_3;
  U32 offsetSaved_3;
  U32 offset_2_3;
  U32 offset_1_3;
  BYTE *ilimit_3;
  BYTE *iend_3;
  BYTE *prefixStart_3;
  U32 prefixStartIndex_3;
  U32 validStartIndex_3;
  U32 maxDistance_3;
  U32 endIndex_3;
  BYTE *anchor_3;
  BYTE *ip1_3;
  BYTE *ip0_3;
  BYTE *istart_3;
  BYTE *base_3;
  size_t stepSize_3;
  U32 hlog_3;
  U32 *hashTable_3;
  ZSTD_compressionParameters *cParams_3;
  U32 tmpOff_2;
  size_t rLength_2;
  size_t step_2;
  U32 offcode_2;
  BYTE *match1_2;
  BYTE *match0_2;
  BYTE *repMatch_2;
  U32 matchIndex1_2;
  U32 matchIndex0_2;
  U32 current1_2;
  U32 current0_2;
  U32 val1_2;
  size_t h1_2;
  U32 val0_2;
  size_t h0_2;
  BYTE *ip2_2;
  size_t mLength_2;
  U32 maxRep_2;
  U32 offsetSaved_2;
  U32 offset_2_2;
  U32 offset_1_2;
  BYTE *ilimit_2;
  BYTE *iend_2;
  BYTE *prefixStart_2;
  U32 prefixStartIndex_2;
  U32 validStartIndex_2;
  U32 maxDistance_2;
  U32 endIndex_2;
  BYTE *anchor_2;
  BYTE *ip1_2;
  BYTE *ip0_2;
  BYTE *istart_2;
  BYTE *base_2;
  size_t stepSize_2;
  U32 hlog_2;
  U32 *hashTable_2;
  ZSTD_compressionParameters *cParams_2;
  U32 tmpOff_1;
  size_t rLength_1;
  size_t step_1;
  U32 offcode_1;
  BYTE *match1_1;
  BYTE *match0_1;
  BYTE *repMatch_1;
  U32 matchIndex1_1;
  U32 matchIndex0_1;
  U32 current1_1;
  U32 current0_1;
  U32 val1_1;
  size_t h1_1;
  U32 val0_1;
  size_t h0_1;
  BYTE *ip2_1;
  size_t mLength_1;
  U32 maxRep_1;
  U32 offsetSaved_1;
  U32 offset_2_1;
  U32 offset_1_1;
  BYTE *ilimit_1;
  BYTE *iend_1;
  BYTE *prefixStart_1;
  U32 prefixStartIndex_1;
  U32 validStartIndex_1;
  U32 maxDistance_1;
  U32 endIndex_1;
  BYTE *anchor_1;
  BYTE *ip1_1;
  BYTE *ip0_1;
  BYTE *istart_1;
  BYTE *base_1;
  size_t stepSize_1;
  U32 hlog_1;
  U32 *hashTable_1;
  ZSTD_compressionParameters *cParams_1;
  U32 tmpOff;
  size_t rLength;
  size_t step;
  U32 offcode;
  BYTE *match1;
  BYTE *match0;
  BYTE *repMatch;
  U32 matchIndex1;
  U32 matchIndex0;
  U32 current1;
  U32 current0;
  U32 val1;
  size_t h1;
  U32 val0;
  size_t h0;
  BYTE *ip2;
  size_t mLength;
  U32 maxRep;
  U32 offsetSaved;
  U32 offset_2;
  U32 offset_1;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 validStartIndex;
  U32 maxDistance;
  U32 endIndex;
  BYTE *anchor;
  BYTE *ip1;
  BYTE *ip0;
  BYTE *istart;
  BYTE *base;
  size_t stepSize;
  U32 hlog;
  U32 *hashTable;
  ZSTD_compressionParameters *cParams;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  BYTE *litEnd_5;
  BYTE *litLimit_w_5;
  BYTE *litEnd_4;
  BYTE *litLimit_w_4;
  BYTE *litEnd_7;
  BYTE *litLimit_w_7;
  BYTE *litEnd_6;
  BYTE *litLimit_w_6;
  BYTE *oend_6;
  BYTE *op_6;
  BYTE *ip_6;
  ptrdiff_t diff_6;
  BYTE *oend_7;
  BYTE *op_7;
  BYTE *ip_7;
  ptrdiff_t diff_7;
  BYTE *oend_4;
  BYTE *op_4;
  BYTE *ip_4;
  ptrdiff_t diff_4;
  BYTE *oend_5;
  BYTE *op_5;
  BYTE *ip_5;
  ptrdiff_t diff_5;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_3;
  ptrdiff_t diff_3;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3da5,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  iVar9 = (int)srcSize;
  iVar7 = (int)src;
  switch((ms->cParams).minMatch) {
  default:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    iVar9 = (iVar7 - iVar8) + iVar9;
    uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_8ec = (ms->window).dictLimit;
    if (uVar10 < iVar9 - local_8ec) {
      local_8ec = iVar9 - uVar10;
    }
    pBVar16 = pBVar6 + local_8ec;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar10 = *rep;
    uVar4 = rep[1];
    mLength._4_4_ = 0;
    ip1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar16));
    anchor = ip1 + 1;
    uVar11 = (int)ip1 - (int)pBVar16;
    maxRep = uVar4;
    if (uVar11 < uVar4) {
      maxRep = 0;
      mLength._4_4_ = uVar4;
    }
    offsetSaved = uVar10;
    _maxDistance = (BYTE *)src;
    if (uVar11 < uVar10) {
      offsetSaved = 0;
      mLength._4_4_ = uVar10;
    }
LAB_0011eadc:
    if (anchor < pBVar18) {
      pBVar19 = ip1 + 2;
      sVar20 = ZSTD_hashPtr(ip1,UVar1,4);
      UVar12 = MEM_read32(ip1);
      sVar21 = ZSTD_hashPtr(anchor,UVar1,4);
      UVar13 = MEM_read32(anchor);
      uVar11 = (int)ip1 - iVar8;
      uVar10 = pUVar5[sVar20];
      uVar4 = pUVar5[sVar21];
      pBVar22 = pBVar19 + -(ulong)offsetSaved;
      match1 = pBVar6 + uVar10;
      pUVar5[sVar20] = uVar11;
      pUVar5[sVar21] = (int)anchor - iVar8;
      if (ip1 + 1 != anchor) {
        __assert_fail("ip0 + 1 == ip1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d56,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      UVar14 = MEM_read32(pBVar22);
      UVar15 = MEM_read32(pBVar19);
      if (offsetSaved == 0 || UVar14 != UVar15) {
        if ((uVar10 <= local_8ec) || (UVar14 = MEM_read32(match1), UVar14 != UVar12)) {
          if ((uVar4 <= local_8ec) || (UVar12 = MEM_read32(pBVar6 + uVar4), UVar12 != UVar13)) {
            uVar25 = ((ulong)((long)ip1 - (long)_maxDistance) >> 7) +
                     (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
            if (uVar25 < 2) {
              __assert_fail("step >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3d6a,
                            "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            ip1 = ip1 + uVar25;
            anchor = anchor + uVar25;
            goto LAB_0011eadc;
          }
          ip1 = anchor;
          match1 = pBVar6 + uVar4;
        }
        maxRep = offsetSaved;
        offsetSaved = (int)ip1 - (int)match1;
        step._4_4_ = offsetSaved + 2;
        ip2 = (BYTE *)0x0;
        while( true ) {
          bVar26 = false;
          if (_maxDistance < ip1 && pBVar16 < match1) {
            bVar26 = ip1[-1] == match1[-1];
          }
          if (!bVar26) break;
          ip1 = ip1 + -1;
          match1 = match1 + -1;
          ip2 = ip2 + 1;
        }
      }
      else {
        ip2 = (BYTE *)(long)(int)(uint)(ip1[1] == pBVar22[-1]);
        ip1 = pBVar19 + -(long)ip2;
        match1 = pBVar22 + -(long)ip2;
        step._4_4_ = 0;
      }
      sVar20 = ZSTD_count(ip1 + (long)ip2 + 4,match1 + (long)ip2 + 4,pBVar17);
      pBVar19 = ip2 + sVar20 + 4;
      uVar25 = (long)ip1 - (long)_maxDistance;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 < _maxDistance + uVar25) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 + -0x20 < _maxDistance + uVar25) {
        ZSTD_safecopyLiterals(seqStore->lit,_maxDistance,_maxDistance + uVar25,pBVar17 + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,_maxDistance);
        if (0x10 < uVar25) {
          pBVar22 = seqStore->lit;
          pBVar24 = pBVar22 + 0x10;
          lVar23 = (long)pBVar24 - (long)(_maxDistance + 0x10);
          if (lVar23 < 8 && -0x10 < lVar23) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if (lVar23 < 0x10 && -0x10 < lVar23) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(pBVar24,_maxDistance + 0x10);
          while (pBVar22 = pBVar22 + 0x20, pBVar22 < pBVar24 + (uVar25 - 0x10)) {
            op = _maxDistance + 0x20;
            ZSTD_copy16(pBVar22,op);
            ZSTD_copy16(pBVar22 + 0x10,_maxDistance + 0x30);
            _maxDistance = op;
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar25;
      if (0xffff < uVar25) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)uVar25;
      seqStore->sequences->offset = step._4_4_ + 1;
      if ((BYTE *)0xffff < pBVar19 + -3) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
      seqStore->sequences = seqStore->sequences + 1;
      _maxDistance = pBVar19 + (long)ip1;
      anchor = _maxDistance + 1;
      ip1 = _maxDistance;
      if (_maxDistance <= pBVar18) {
        if (pBVar6 + (ulong)uVar11 + 2 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d84,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        sVar20 = ZSTD_hashPtr(pBVar6 + (ulong)uVar11 + 2,UVar1,4);
        pUVar5[sVar20] = uVar11 + 2;
        sVar20 = ZSTD_hashPtr(_maxDistance + -2,UVar1,4);
        pUVar5[sVar20] = ((int)_maxDistance + -2) - iVar8;
        ip1 = _maxDistance;
        while( true ) {
          UVar12 = maxRep;
          bVar26 = false;
          if (ip1 <= pBVar18 && maxRep != 0) {
            UVar13 = MEM_read32(ip1);
            UVar14 = MEM_read32(ip1 + -(ulong)maxRep);
            bVar26 = UVar13 == UVar14;
          }
          _maxDistance = ip1;
          if (!bVar26) break;
          sVar20 = ZSTD_count(ip1 + 4,ip1 + (4 - (ulong)maxRep),pBVar17);
          maxRep = offsetSaved;
          offsetSaved = UVar12;
          sVar21 = ZSTD_hashPtr(ip1,UVar1,4);
          pUVar5[sVar21] = (int)ip1 - iVar8;
          anchor = ip1 + sVar20 + 4 + 1;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < ip1) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < ip1) {
            ZSTD_safecopyLiterals(seqStore->lit,ip1,ip1,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,ip1);
          }
          seqStore->lit = seqStore->lit;
          seqStore->sequences->litLength = 0;
          seqStore->sequences->offset = 1;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(sVar20 + 1);
          seqStore->sequences = seqStore->sequences + 1;
          ip1 = ip1 + sVar20 + 4;
        }
      }
      goto LAB_0011eadc;
    }
    if (offsetSaved == 0) {
      local_934 = mLength._4_4_;
    }
    else {
      local_934 = offsetSaved;
    }
    *rep = local_934;
    if (maxRep == 0) {
      local_938 = mLength._4_4_;
    }
    else {
      local_938 = maxRep;
    }
    rep[1] = local_938;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_maxDistance);
    break;
  case 5:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    iVar9 = (iVar7 - iVar8) + iVar9;
    uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_93c = (ms->window).dictLimit;
    if (uVar10 < iVar9 - local_93c) {
      local_93c = iVar9 - uVar10;
    }
    pBVar16 = pBVar6 + local_93c;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar10 = *rep;
    uVar4 = rep[1];
    mLength_1._4_4_ = 0;
    ip1_1 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar16));
    anchor_1 = ip1_1 + 1;
    uVar11 = (int)ip1_1 - (int)pBVar16;
    maxRep_1 = uVar4;
    if (uVar11 < uVar4) {
      maxRep_1 = 0;
      mLength_1._4_4_ = uVar4;
    }
    offsetSaved_1 = uVar10;
    _maxDistance_1 = (BYTE *)src;
    if (uVar11 < uVar10) {
      offsetSaved_1 = 0;
      mLength_1._4_4_ = uVar10;
    }
LAB_0011ff07:
    if (anchor_1 < pBVar18) {
      pBVar19 = ip1_1 + 2;
      sVar20 = ZSTD_hashPtr(ip1_1,UVar1,5);
      UVar12 = MEM_read32(ip1_1);
      sVar21 = ZSTD_hashPtr(anchor_1,UVar1,5);
      UVar13 = MEM_read32(anchor_1);
      uVar11 = (int)ip1_1 - iVar8;
      uVar10 = pUVar5[sVar20];
      uVar4 = pUVar5[sVar21];
      pBVar22 = pBVar19 + -(ulong)offsetSaved_1;
      match1_1 = pBVar6 + uVar10;
      pUVar5[sVar20] = uVar11;
      pUVar5[sVar21] = (int)anchor_1 - iVar8;
      if (ip1_1 + 1 != anchor_1) {
        __assert_fail("ip0 + 1 == ip1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d56,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      UVar14 = MEM_read32(pBVar22);
      UVar15 = MEM_read32(pBVar19);
      if (offsetSaved_1 == 0 || UVar14 != UVar15) {
        if ((uVar10 <= local_93c) || (UVar14 = MEM_read32(match1_1), UVar14 != UVar12)) {
          if ((uVar4 <= local_93c) || (UVar12 = MEM_read32(pBVar6 + uVar4), UVar12 != UVar13)) {
            uVar25 = ((ulong)((long)ip1_1 - (long)_maxDistance_1) >> 7) +
                     (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
            if (uVar25 < 2) {
              __assert_fail("step >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3d6a,
                            "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            ip1_1 = ip1_1 + uVar25;
            anchor_1 = anchor_1 + uVar25;
            goto LAB_0011ff07;
          }
          ip1_1 = anchor_1;
          match1_1 = pBVar6 + uVar4;
        }
        maxRep_1 = offsetSaved_1;
        offsetSaved_1 = (int)ip1_1 - (int)match1_1;
        step_1._4_4_ = offsetSaved_1 + 2;
        ip2_1 = (BYTE *)0x0;
        while( true ) {
          bVar26 = false;
          if (_maxDistance_1 < ip1_1 && pBVar16 < match1_1) {
            bVar26 = ip1_1[-1] == match1_1[-1];
          }
          if (!bVar26) break;
          ip1_1 = ip1_1 + -1;
          match1_1 = match1_1 + -1;
          ip2_1 = ip2_1 + 1;
        }
      }
      else {
        ip2_1 = (BYTE *)(long)(int)(uint)(ip1_1[1] == pBVar22[-1]);
        ip1_1 = pBVar19 + -(long)ip2_1;
        match1_1 = pBVar22 + -(long)ip2_1;
        step_1._4_4_ = 0;
      }
      sVar20 = ZSTD_count(ip1_1 + (long)ip2_1 + 4,match1_1 + (long)ip2_1 + 4,pBVar17);
      pBVar19 = ip2_1 + sVar20 + 4;
      uVar25 = (long)ip1_1 - (long)_maxDistance_1;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 < _maxDistance_1 + uVar25) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 + -0x20 < _maxDistance_1 + uVar25) {
        ZSTD_safecopyLiterals(seqStore->lit,_maxDistance_1,_maxDistance_1 + uVar25,pBVar17 + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,_maxDistance_1);
        if (0x10 < uVar25) {
          pBVar22 = seqStore->lit;
          pBVar24 = pBVar22 + 0x10;
          lVar23 = (long)pBVar24 - (long)(_maxDistance_1 + 0x10);
          if (lVar23 < 8 && -0x10 < lVar23) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if (lVar23 < 0x10 && -0x10 < lVar23) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(pBVar24,_maxDistance_1 + 0x10);
          while (pBVar22 = pBVar22 + 0x20, pBVar22 < pBVar24 + (uVar25 - 0x10)) {
            op_2 = _maxDistance_1 + 0x20;
            ZSTD_copy16(pBVar22,op_2);
            ZSTD_copy16(pBVar22 + 0x10,_maxDistance_1 + 0x30);
            _maxDistance_1 = op_2;
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar25;
      if (0xffff < uVar25) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)uVar25;
      seqStore->sequences->offset = step_1._4_4_ + 1;
      if ((BYTE *)0xffff < pBVar19 + -3) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
      seqStore->sequences = seqStore->sequences + 1;
      _maxDistance_1 = pBVar19 + (long)ip1_1;
      anchor_1 = _maxDistance_1 + 1;
      ip1_1 = _maxDistance_1;
      if (_maxDistance_1 <= pBVar18) {
        if (pBVar6 + (ulong)uVar11 + 2 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d84,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        sVar20 = ZSTD_hashPtr(pBVar6 + (ulong)uVar11 + 2,UVar1,5);
        pUVar5[sVar20] = uVar11 + 2;
        sVar20 = ZSTD_hashPtr(_maxDistance_1 + -2,UVar1,5);
        pUVar5[sVar20] = ((int)_maxDistance_1 + -2) - iVar8;
        ip1_1 = _maxDistance_1;
        while( true ) {
          UVar12 = maxRep_1;
          bVar26 = false;
          if (ip1_1 <= pBVar18 && maxRep_1 != 0) {
            UVar13 = MEM_read32(ip1_1);
            UVar14 = MEM_read32(ip1_1 + -(ulong)maxRep_1);
            bVar26 = UVar13 == UVar14;
          }
          _maxDistance_1 = ip1_1;
          if (!bVar26) break;
          sVar20 = ZSTD_count(ip1_1 + 4,ip1_1 + (4 - (ulong)maxRep_1),pBVar17);
          maxRep_1 = offsetSaved_1;
          offsetSaved_1 = UVar12;
          sVar21 = ZSTD_hashPtr(ip1_1,UVar1,5);
          pUVar5[sVar21] = (int)ip1_1 - iVar8;
          anchor_1 = ip1_1 + sVar20 + 4 + 1;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < ip1_1) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < ip1_1) {
            ZSTD_safecopyLiterals(seqStore->lit,ip1_1,ip1_1,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,ip1_1);
          }
          seqStore->lit = seqStore->lit;
          seqStore->sequences->litLength = 0;
          seqStore->sequences->offset = 1;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(sVar20 + 1);
          seqStore->sequences = seqStore->sequences + 1;
          ip1_1 = ip1_1 + sVar20 + 4;
        }
      }
      goto LAB_0011ff07;
    }
    if (offsetSaved_1 == 0) {
      local_984 = mLength_1._4_4_;
    }
    else {
      local_984 = offsetSaved_1;
    }
    *rep = local_984;
    if (maxRep_1 == 0) {
      local_988 = mLength_1._4_4_;
    }
    else {
      local_988 = maxRep_1;
    }
    rep[1] = local_988;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_maxDistance_1);
    break;
  case 6:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    iVar9 = (iVar7 - iVar8) + iVar9;
    uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_98c = (ms->window).dictLimit;
    if (uVar10 < iVar9 - local_98c) {
      local_98c = iVar9 - uVar10;
    }
    pBVar16 = pBVar6 + local_98c;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar10 = *rep;
    uVar4 = rep[1];
    mLength_2._4_4_ = 0;
    ip1_2 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar16));
    anchor_2 = ip1_2 + 1;
    uVar11 = (int)ip1_2 - (int)pBVar16;
    maxRep_2 = uVar4;
    if (uVar11 < uVar4) {
      maxRep_2 = 0;
      mLength_2._4_4_ = uVar4;
    }
    offsetSaved_2 = uVar10;
    _maxDistance_2 = (BYTE *)src;
    if (uVar11 < uVar10) {
      offsetSaved_2 = 0;
      mLength_2._4_4_ = uVar10;
    }
LAB_0012146a:
    if (anchor_2 < pBVar18) {
      pBVar19 = ip1_2 + 2;
      sVar20 = ZSTD_hashPtr(ip1_2,UVar1,6);
      UVar12 = MEM_read32(ip1_2);
      sVar21 = ZSTD_hashPtr(anchor_2,UVar1,6);
      UVar13 = MEM_read32(anchor_2);
      uVar11 = (int)ip1_2 - iVar8;
      uVar10 = pUVar5[sVar20];
      uVar4 = pUVar5[sVar21];
      pBVar22 = pBVar19 + -(ulong)offsetSaved_2;
      match1_2 = pBVar6 + uVar10;
      pUVar5[sVar20] = uVar11;
      pUVar5[sVar21] = (int)anchor_2 - iVar8;
      if (ip1_2 + 1 != anchor_2) {
        __assert_fail("ip0 + 1 == ip1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d56,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      UVar14 = MEM_read32(pBVar22);
      UVar15 = MEM_read32(pBVar19);
      if (offsetSaved_2 == 0 || UVar14 != UVar15) {
        if ((uVar10 <= local_98c) || (UVar14 = MEM_read32(match1_2), UVar14 != UVar12)) {
          if ((uVar4 <= local_98c) || (UVar12 = MEM_read32(pBVar6 + uVar4), UVar12 != UVar13)) {
            uVar25 = ((ulong)((long)ip1_2 - (long)_maxDistance_2) >> 7) +
                     (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
            if (uVar25 < 2) {
              __assert_fail("step >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3d6a,
                            "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            ip1_2 = ip1_2 + uVar25;
            anchor_2 = anchor_2 + uVar25;
            goto LAB_0012146a;
          }
          ip1_2 = anchor_2;
          match1_2 = pBVar6 + uVar4;
        }
        maxRep_2 = offsetSaved_2;
        offsetSaved_2 = (int)ip1_2 - (int)match1_2;
        step_2._4_4_ = offsetSaved_2 + 2;
        ip2_2 = (BYTE *)0x0;
        while( true ) {
          bVar26 = false;
          if (_maxDistance_2 < ip1_2 && pBVar16 < match1_2) {
            bVar26 = ip1_2[-1] == match1_2[-1];
          }
          if (!bVar26) break;
          ip1_2 = ip1_2 + -1;
          match1_2 = match1_2 + -1;
          ip2_2 = ip2_2 + 1;
        }
      }
      else {
        ip2_2 = (BYTE *)(long)(int)(uint)(ip1_2[1] == pBVar22[-1]);
        ip1_2 = pBVar19 + -(long)ip2_2;
        match1_2 = pBVar22 + -(long)ip2_2;
        step_2._4_4_ = 0;
      }
      sVar20 = ZSTD_count(ip1_2 + (long)ip2_2 + 4,match1_2 + (long)ip2_2 + 4,pBVar17);
      pBVar19 = ip2_2 + sVar20 + 4;
      uVar25 = (long)ip1_2 - (long)_maxDistance_2;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 < _maxDistance_2 + uVar25) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 + -0x20 < _maxDistance_2 + uVar25) {
        ZSTD_safecopyLiterals(seqStore->lit,_maxDistance_2,_maxDistance_2 + uVar25,pBVar17 + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,_maxDistance_2);
        if (0x10 < uVar25) {
          pBVar22 = seqStore->lit;
          pBVar24 = pBVar22 + 0x10;
          lVar23 = (long)pBVar24 - (long)(_maxDistance_2 + 0x10);
          if (lVar23 < 8 && -0x10 < lVar23) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if (lVar23 < 0x10 && -0x10 < lVar23) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(pBVar24,_maxDistance_2 + 0x10);
          while (pBVar22 = pBVar22 + 0x20, pBVar22 < pBVar24 + (uVar25 - 0x10)) {
            op_4 = _maxDistance_2 + 0x20;
            ZSTD_copy16(pBVar22,op_4);
            ZSTD_copy16(pBVar22 + 0x10,_maxDistance_2 + 0x30);
            _maxDistance_2 = op_4;
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar25;
      if (0xffff < uVar25) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)uVar25;
      seqStore->sequences->offset = step_2._4_4_ + 1;
      if ((BYTE *)0xffff < pBVar19 + -3) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
      seqStore->sequences = seqStore->sequences + 1;
      _maxDistance_2 = pBVar19 + (long)ip1_2;
      anchor_2 = _maxDistance_2 + 1;
      ip1_2 = _maxDistance_2;
      if (_maxDistance_2 <= pBVar18) {
        if (pBVar6 + (ulong)uVar11 + 2 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d84,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        sVar20 = ZSTD_hashPtr(pBVar6 + (ulong)uVar11 + 2,UVar1,6);
        pUVar5[sVar20] = uVar11 + 2;
        sVar20 = ZSTD_hashPtr(_maxDistance_2 + -2,UVar1,6);
        pUVar5[sVar20] = ((int)_maxDistance_2 + -2) - iVar8;
        ip1_2 = _maxDistance_2;
        while( true ) {
          UVar12 = maxRep_2;
          bVar26 = false;
          if (ip1_2 <= pBVar18 && maxRep_2 != 0) {
            UVar13 = MEM_read32(ip1_2);
            UVar14 = MEM_read32(ip1_2 + -(ulong)maxRep_2);
            bVar26 = UVar13 == UVar14;
          }
          _maxDistance_2 = ip1_2;
          if (!bVar26) break;
          sVar20 = ZSTD_count(ip1_2 + 4,ip1_2 + (4 - (ulong)maxRep_2),pBVar17);
          maxRep_2 = offsetSaved_2;
          offsetSaved_2 = UVar12;
          sVar21 = ZSTD_hashPtr(ip1_2,UVar1,6);
          pUVar5[sVar21] = (int)ip1_2 - iVar8;
          anchor_2 = ip1_2 + sVar20 + 4 + 1;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < ip1_2) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < ip1_2) {
            ZSTD_safecopyLiterals(seqStore->lit,ip1_2,ip1_2,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,ip1_2);
          }
          seqStore->lit = seqStore->lit;
          seqStore->sequences->litLength = 0;
          seqStore->sequences->offset = 1;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(sVar20 + 1);
          seqStore->sequences = seqStore->sequences + 1;
          ip1_2 = ip1_2 + sVar20 + 4;
        }
      }
      goto LAB_0012146a;
    }
    if (offsetSaved_2 == 0) {
      local_9d4 = mLength_2._4_4_;
    }
    else {
      local_9d4 = offsetSaved_2;
    }
    *rep = local_9d4;
    if (maxRep_2 == 0) {
      local_9d8 = mLength_2._4_4_;
    }
    else {
      local_9d8 = maxRep_2;
    }
    rep[1] = local_9d8;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_maxDistance_2);
    break;
  case 7:
    pUVar5 = ms->hashTable;
    UVar1 = (ms->cParams).hashLog;
    uVar2 = (ms->cParams).targetLength;
    uVar3 = (ms->cParams).targetLength;
    pBVar6 = (ms->window).base;
    iVar8 = (int)pBVar6;
    iVar9 = (iVar7 - iVar8) + iVar9;
    uVar10 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    local_9dc = (ms->window).dictLimit;
    if (uVar10 < iVar9 - local_9dc) {
      local_9dc = iVar9 - uVar10;
    }
    pBVar16 = pBVar6 + local_9dc;
    pBVar17 = (BYTE *)((long)src + srcSize);
    pBVar18 = pBVar17 + -8;
    uVar10 = *rep;
    uVar4 = rep[1];
    mLength_3._4_4_ = 0;
    ip1_3 = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == pBVar16));
    anchor_3 = ip1_3 + 1;
    uVar11 = (int)ip1_3 - (int)pBVar16;
    maxRep_3 = uVar4;
    if (uVar11 < uVar4) {
      maxRep_3 = 0;
      mLength_3._4_4_ = uVar4;
    }
    offsetSaved_3 = uVar10;
    _maxDistance_3 = (BYTE *)src;
    if (uVar11 < uVar10) {
      offsetSaved_3 = 0;
      mLength_3._4_4_ = uVar10;
    }
LAB_001229cd:
    if (anchor_3 < pBVar18) {
      pBVar19 = ip1_3 + 2;
      sVar20 = ZSTD_hashPtr(ip1_3,UVar1,7);
      UVar12 = MEM_read32(ip1_3);
      sVar21 = ZSTD_hashPtr(anchor_3,UVar1,7);
      UVar13 = MEM_read32(anchor_3);
      uVar11 = (int)ip1_3 - iVar8;
      uVar10 = pUVar5[sVar20];
      uVar4 = pUVar5[sVar21];
      pBVar22 = pBVar19 + -(ulong)offsetSaved_3;
      match1_3 = pBVar6 + uVar10;
      pUVar5[sVar20] = uVar11;
      pUVar5[sVar21] = (int)anchor_3 - iVar8;
      if (ip1_3 + 1 != anchor_3) {
        __assert_fail("ip0 + 1 == ip1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3d56,
                      "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
      UVar14 = MEM_read32(pBVar22);
      UVar15 = MEM_read32(pBVar19);
      if (offsetSaved_3 == 0 || UVar14 != UVar15) {
        if ((uVar10 <= local_9dc) || (UVar14 = MEM_read32(match1_3), UVar14 != UVar12)) {
          if ((uVar4 <= local_9dc) || (UVar12 = MEM_read32(pBVar6 + uVar4), UVar12 != UVar13)) {
            uVar25 = ((ulong)((long)ip1_3 - (long)_maxDistance_3) >> 7) +
                     (ulong)(uVar2 + ((uVar3 != 0 ^ 0xffU) & 1) + 1);
            if (uVar25 < 2) {
              __assert_fail("step >= 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3d6a,
                            "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            ip1_3 = ip1_3 + uVar25;
            anchor_3 = anchor_3 + uVar25;
            goto LAB_001229cd;
          }
          ip1_3 = anchor_3;
          match1_3 = pBVar6 + uVar4;
        }
        maxRep_3 = offsetSaved_3;
        offsetSaved_3 = (int)ip1_3 - (int)match1_3;
        step_3._4_4_ = offsetSaved_3 + 2;
        ip2_3 = (BYTE *)0x0;
        while( true ) {
          bVar26 = false;
          if (_maxDistance_3 < ip1_3 && pBVar16 < match1_3) {
            bVar26 = ip1_3[-1] == match1_3[-1];
          }
          if (!bVar26) break;
          ip1_3 = ip1_3 + -1;
          match1_3 = match1_3 + -1;
          ip2_3 = ip2_3 + 1;
        }
      }
      else {
        ip2_3 = (BYTE *)(long)(int)(uint)(ip1_3[1] == pBVar22[-1]);
        ip1_3 = pBVar19 + -(long)ip2_3;
        match1_3 = pBVar22 + -(long)ip2_3;
        step_3._4_4_ = 0;
      }
      sVar20 = ZSTD_count(ip1_3 + (long)ip2_3 + 4,match1_3 + (long)ip2_3 + 4,pBVar17);
      pBVar19 = ip2_3 + sVar20 + 4;
      uVar25 = (long)ip1_3 - (long)_maxDistance_3;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar25) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 < _maxDistance_3 + uVar25) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar17 + -0x20 < _maxDistance_3 + uVar25) {
        ZSTD_safecopyLiterals(seqStore->lit,_maxDistance_3,_maxDistance_3 + uVar25,pBVar17 + -0x20);
      }
      else {
        ZSTD_copy16(seqStore->lit,_maxDistance_3);
        if (0x10 < uVar25) {
          pBVar22 = seqStore->lit;
          pBVar24 = pBVar22 + 0x10;
          lVar23 = (long)pBVar24 - (long)(_maxDistance_3 + 0x10);
          if (lVar23 < 8 && -0x10 < lVar23) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if (lVar23 < 0x10 && -0x10 < lVar23) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(pBVar24,_maxDistance_3 + 0x10);
          while (pBVar22 = pBVar22 + 0x20, pBVar22 < pBVar24 + (uVar25 - 0x10)) {
            op_6 = _maxDistance_3 + 0x20;
            ZSTD_copy16(pBVar22,op_6);
            ZSTD_copy16(pBVar22 + 0x10,_maxDistance_3 + 0x30);
            _maxDistance_3 = op_6;
          }
        }
      }
      seqStore->lit = seqStore->lit + uVar25;
      if (0xffff < uVar25) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->litLength = (U16)uVar25;
      seqStore->sequences->offset = step_3._4_4_ + 1;
      if ((BYTE *)0xffff < pBVar19 + -3) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      }
      seqStore->sequences->matchLength = (U16)(pBVar19 + -3);
      seqStore->sequences = seqStore->sequences + 1;
      _maxDistance_3 = pBVar19 + (long)ip1_3;
      anchor_3 = _maxDistance_3 + 1;
      ip1_3 = _maxDistance_3;
      if (_maxDistance_3 <= pBVar18) {
        if (pBVar6 + (ulong)uVar11 + 2 <= src) {
          __assert_fail("base+current0+2 > istart",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d84,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        sVar20 = ZSTD_hashPtr(pBVar6 + (ulong)uVar11 + 2,UVar1,7);
        pUVar5[sVar20] = uVar11 + 2;
        sVar20 = ZSTD_hashPtr(_maxDistance_3 + -2,UVar1,7);
        pUVar5[sVar20] = ((int)_maxDistance_3 + -2) - iVar8;
        ip1_3 = _maxDistance_3;
        while( true ) {
          UVar12 = maxRep_3;
          bVar26 = false;
          if (ip1_3 <= pBVar18 && maxRep_3 != 0) {
            UVar13 = MEM_read32(ip1_3);
            UVar14 = MEM_read32(ip1_3 + -(ulong)maxRep_3);
            bVar26 = UVar13 == UVar14;
          }
          _maxDistance_3 = ip1_3;
          if (!bVar26) break;
          sVar20 = ZSTD_count(ip1_3 + 4,ip1_3 + (4 - (ulong)maxRep_3),pBVar17);
          maxRep_3 = offsetSaved_3;
          offsetSaved_3 = UVar12;
          sVar21 = ZSTD_hashPtr(ip1_3,UVar1,7);
          pUVar5[sVar21] = (int)ip1_3 - iVar8;
          anchor_3 = ip1_3 + sVar20 + 4 + 1;
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 < ip1_3) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (pBVar17 + -0x20 < ip1_3) {
            ZSTD_safecopyLiterals(seqStore->lit,ip1_3,ip1_3,pBVar17 + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,ip1_3);
          }
          seqStore->lit = seqStore->lit;
          seqStore->sequences->litLength = 0;
          seqStore->sequences->offset = 1;
          if (0xffff < sVar20 + 1) {
            if (seqStore->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->matchLength = (U16)(sVar20 + 1);
          seqStore->sequences = seqStore->sequences + 1;
          ip1_3 = ip1_3 + sVar20 + 4;
        }
      }
      goto LAB_001229cd;
    }
    if (offsetSaved_3 == 0) {
      local_a24 = mLength_3._4_4_;
    }
    else {
      local_a24 = offsetSaved_3;
    }
    *rep = local_a24;
    if (maxRep_3 == 0) {
      local_a28 = mLength_3._4_4_;
    }
    else {
      local_a28 = maxRep_3;
    }
    rep[1] = local_a28;
    ms_local = (ZSTD_matchState_t *)(pBVar17 + -(long)_maxDistance_3);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}